

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O1

void __thiscall CMU462::ImageBuffer::update_pixel(ImageBuffer *this,Color *c,size_t x,size_t y)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = c->a;
  if (1.0 <= fVar1) {
    fVar1 = 1.0;
  }
  fVar2 = c->b;
  if (1.0 <= fVar2) {
    fVar2 = 1.0;
  }
  fVar3 = c->r;
  fVar4 = c->g;
  if (1.0 <= fVar4) {
    fVar4 = 1.0;
  }
  if (1.0 <= fVar3) {
    fVar3 = 1.0;
  }
  (this->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[y * this->w + x] =
       (int)(long)(fVar3 * 255.0) + (int)(long)(fVar4 * 255.0) * 0x100 +
       (int)(long)(fVar2 * 255.0) * 0x10000 + (int)(long)(fVar1 * 255.0) * 0x1000000;
  return;
}

Assistant:

void update_pixel(const Color& c, size_t x, size_t y) {
      // assert(0 <= x && x < w);
      // assert(0 <= y && y < h);
      uint32_t p = 0;
      p += ((uint32_t) (clamp(0.f, 1.f, c.a) * 255)) << 24;
      p += ((uint32_t) (clamp(0.f, 1.f, c.b) * 255)) << 16;
      p += ((uint32_t) (clamp(0.f, 1.f, c.g) * 255)) << 8;
      p += ((uint32_t) (clamp(0.f, 1.f, c.r) * 255));
      data[x + y * w] = p;
    }